

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVec2 *lhs;
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  ImGuiID IVar5;
  ImGuiWindow *pIVar6;
  ImGuiGroupData *pIVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  bool bVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  long lVar14;
  char cVar15;
  ImGuiID IVar16;
  bool bVar17;
  uint uVar18;
  ImRect group_bb;
  float local_48;
  float fStack_44;
  ImVec2 local_38;
  
  pIVar12 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  pIVar7 = (GImGui->GroupStack).Data;
  lVar14 = (long)(GImGui->GroupStack).Size;
  lhs = &(pIVar6->DC).CursorMaxPos;
  IVar9 = ImMax(lhs,&pIVar7[lVar14 + -1].BackupCursorPos);
  IVar8 = pIVar7[lVar14 + -1].BackupCursorPos;
  (pIVar6->DC).CursorPos = IVar8;
  group_bb.Min = IVar8;
  group_bb.Max = IVar9;
  IVar10 = ImMax(&pIVar7[lVar14 + -1].BackupCursorMaxPos,lhs);
  (pIVar6->DC).CursorMaxPos = IVar10;
  (pIVar6->DC).Indent.x = pIVar7[lVar14 + -1].BackupIndent.x;
  (pIVar6->DC).GroupOffset.x = pIVar7[lVar14 + -1].BackupGroupOffset.x;
  (pIVar6->DC).CurrLineSize = pIVar7[lVar14 + -1].BackupCurrLineSize;
  fVar2 = pIVar7[lVar14 + -1].BackupCurrLineTextBaseOffset;
  (pIVar6->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar12->LogEnabled == true) {
    pIVar12->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar7[lVar14 + -1].EmitItem != true) goto LAB_00116289;
  fVar3 = (pIVar6->DC).PrevLineTextBaseOffset;
  uVar18 = -(uint)(fVar2 <= fVar3);
  (pIVar6->DC).CurrLineTextBaseOffset = (float)(~uVar18 & (uint)fVar2 | (uint)fVar3 & uVar18);
  local_48 = IVar9.x;
  fStack_44 = IVar9.y;
  local_38.y = fStack_44 - IVar8.y;
  local_38.x = local_48 - IVar8.x;
  ItemSize(&local_38,-1.0);
  ItemAdd(&group_bb,0,(ImRect *)0x0,1);
  IVar5 = pIVar12->ActiveId;
  if (pIVar7[lVar14 + -1].BackupActiveIdIsAlive == IVar5) {
    if (pIVar7[lVar14 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar12->ActiveIdPreviousFrameIsAlive;
joined_r0x00116226:
      if (cVar4 != '\0') {
        IVar16 = pIVar12->ActiveIdPreviousFrame;
        cVar4 = '\x01';
        bVar13 = false;
        goto LAB_0011621a;
      }
    }
    bVar11 = false;
    cVar15 = '\0';
  }
  else {
    bVar17 = pIVar12->ActiveIdIsAlive != IVar5;
    IVar16 = IVar5;
    if (pIVar7[lVar14 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar12->ActiveIdPreviousFrameIsAlive;
      bVar13 = true;
      if (IVar5 == 0 || bVar17) goto joined_r0x00116226;
    }
    else {
      cVar15 = '\0';
      bVar11 = false;
      cVar4 = '\0';
      bVar13 = true;
      if (IVar5 == 0 || bVar17) goto LAB_0011622c;
    }
LAB_0011621a:
    bVar11 = bVar13;
    cVar15 = cVar4;
    (pIVar12->LastItemData).ID = IVar16;
  }
LAB_0011622c:
  (pIVar12->LastItemData).Rect.Min = group_bb.Min;
  (pIVar12->LastItemData).Rect.Max = group_bb.Max;
  if ((pIVar7[lVar14 + -1].BackupHoveredIdIsAlive == false) && (pIVar12->HoveredId != 0)) {
    pIVar1 = &(pIVar12->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar11) && (pIVar12->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar12->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar18 = (pIVar12->LastItemData).StatusFlags;
  (pIVar12->LastItemData).StatusFlags = uVar18 | 0x20;
  if ((cVar15 != '\0') && (IVar5 != pIVar12->ActiveIdPreviousFrame)) {
    (pIVar12->LastItemData).StatusFlags = uVar18 | 0x60;
  }
LAB_00116289:
  (pIVar12->GroupStack).Size = (pIVar12->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}